

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O3

void Ree_ManCutPrint(int *pCut,int Count,word Truth,int iObj)

{
  FILE *__stream;
  uint uVar1;
  undefined4 in_register_00000034;
  word *pThis;
  ulong *puVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  word local_28;
  
  puVar2 = &local_28;
  local_28 = Truth;
  printf("%d : %d : ",CONCAT44(in_register_00000034,Count),(ulong)(uint)iObj);
  if (*pCut < 1) {
    uVar6 = 1;
  }
  else {
    uVar6 = 1;
    do {
      uVar5 = uVar6;
      printf("%3d ",(ulong)(uint)pCut[uVar5]);
      uVar6 = uVar5 + 1;
    } while ((long)uVar5 < (long)*pCut);
    if (3 < uVar5) goto LAB_0066eee6;
  }
  iVar4 = (int)uVar6 + -5;
  do {
    printf("    ");
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0);
LAB_0066eee6:
  printf("0x");
  __stream = _stdout;
  do {
    lVar3 = 4;
    do {
      uVar1 = (uint)(*puVar2 >> ((byte)lVar3 & 0x3f)) & 0xf;
      iVar4 = uVar1 + 0x30;
      if (9 < uVar1) {
        iVar4 = uVar1 + 0x37;
      }
      fputc(iVar4,__stream);
      lVar3 = lVar3 + -4;
    } while (lVar3 != -4);
    puVar2 = puVar2 + -1;
  } while (&local_28 <= puVar2);
  putchar(10);
  return;
}

Assistant:

void Ree_ManCutPrint( int * pCut, int Count, word Truth, int iObj )
{
    int c;
    printf( "%d : %d : ", Count, iObj );
    for ( c = 1; c <= pCut[0]; c++ )
        printf( "%3d ", pCut[c] );
    for (      ; c <= 4; c++ )
        printf( "    " );
    printf( "0x" );
    Abc_TtPrintHexRev( stdout, &Truth, 3 );
    printf( "\n" );
}